

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O3

void btreeblk_set_dirty(void *voidhandle,bid_t bid)

{
  long lVar1;
  
  lVar1 = *(long *)((long)voidhandle + 0x28);
  while( true ) {
    if (lVar1 == 0) {
      return;
    }
    if (*(ulong *)(lVar1 + -0x20) ==
        (bid & 0xffffffffffff) / (ulong)*(ushort *)((long)voidhandle + 4)) break;
    lVar1 = *(long *)(lVar1 + 8);
  }
  *(undefined1 *)(lVar1 + -0x10) = 1;
  return;
}

Assistant:

void btreeblk_set_dirty(void *voidhandle, bid_t bid)
{
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;
    struct list_elem *e;
    struct btreeblk_block *block;
    bid_t _bid;
    bid_t filebid;
    size_t sb, idx;

    sb = idx = 0;
    subbid2bid(bid, &sb, &idx, &_bid);
    filebid = _bid / handle->nnodeperblock;

    // list
    e = list_begin(&handle->read_list);
    while(e){
        block = _get_entry(e, struct btreeblk_block, le);
        if (block->bid == filebid) {
            block->dirty = 1;
            break;
        }
        e = list_next(e);
    }
}